

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx512::
     BVHNIntersectorKHybrid<8,_4,_16777232,_false,_embree::avx512::ArrayIntersectorK_1<4,_embree::avx512::TriangleMiMBIntersectorKMoeller<4,_4,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  undefined8 *puVar1;
  int iVar2;
  undefined4 uVar3;
  undefined1 auVar4 [16];
  Geometry *pGVar5;
  long lVar6;
  RTCFilterFunctionN p_Var7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  int iVar20;
  int iVar21;
  StackItemT<embree::NodeRefPtr<8>_> *pSVar22;
  byte bVar23;
  AABBNodeMB4D *node1;
  undefined1 (*pauVar24) [32];
  long lVar25;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  ulong uVar29;
  ulong uVar30;
  byte bVar31;
  uint uVar32;
  long lVar33;
  ulong uVar34;
  ulong uVar35;
  byte bVar36;
  ulong uVar37;
  ulong uVar38;
  ulong uVar39;
  ulong uVar40;
  ulong uVar41;
  long lVar42;
  ulong uVar43;
  size_t sVar44;
  ulong uVar45;
  ulong uVar46;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar47 [16];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined4 uVar76;
  uint uVar77;
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [64];
  float fVar82;
  float fVar83;
  float fVar84;
  float fVar85;
  undefined1 auVar86 [16];
  undefined1 auVar87 [32];
  undefined1 auVar88 [64];
  float fVar89;
  undefined1 auVar90 [32];
  undefined1 auVar91 [64];
  undefined1 auVar92 [64];
  undefined1 auVar93 [64];
  undefined1 auVar94 [64];
  undefined1 auVar95 [64];
  undefined1 auVar96 [64];
  undefined1 auVar97 [64];
  undefined1 auVar98 [64];
  undefined1 local_2648 [16];
  Geometry *local_2638;
  ulong local_2630;
  ulong local_2628;
  StackItemT<embree::NodeRefPtr<8>_> *local_2620;
  Scene *local_2618;
  long local_2610;
  RTCFilterFunctionNArguments args;
  undefined8 local_25d8;
  undefined8 uStack_25d0;
  undefined1 local_25c8 [16];
  undefined1 local_25b8 [16];
  undefined1 local_25a8 [16];
  undefined1 local_2598 [16];
  byte local_2587;
  float local_2578 [4];
  float local_2568 [4];
  undefined1 local_2558 [16];
  undefined1 local_2548 [16];
  undefined1 local_2538 [16];
  undefined1 local_2528 [16];
  undefined1 local_2518 [16];
  undefined1 local_2508 [16];
  undefined1 local_24f8 [32];
  undefined1 local_24d8 [32];
  undefined1 local_24b8 [32];
  undefined1 local_2498 [32];
  undefined1 local_2478 [32];
  undefined8 local_2458;
  undefined8 uStack_2450;
  HitK<4> h;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  
  local_2620 = stack + 1;
  stack[0].ptr.ptr = root.ptr;
  stack[0].dist = 0;
  auVar66 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->rdir).field_0 + k * 4)));
  auVar94 = ZEXT3264(auVar66);
  auVar67 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->rdir).field_0 + k * 4 + 0x10)));
  auVar95 = ZEXT3264(auVar67);
  auVar68 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->rdir).field_0 + k * 4 + 0x20)));
  auVar96 = ZEXT3264(auVar68);
  auVar47 = vmulss_avx512f(auVar66._0_16_,ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4)));
  uVar76 = auVar47._0_4_;
  auVar69._4_4_ = uVar76;
  auVar69._0_4_ = uVar76;
  auVar69._8_4_ = uVar76;
  auVar69._12_4_ = uVar76;
  auVar69._16_4_ = uVar76;
  auVar69._20_4_ = uVar76;
  auVar69._24_4_ = uVar76;
  auVar69._28_4_ = uVar76;
  auVar47 = vmulss_avx512f(auVar67._0_16_,
                           ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x10)));
  uVar77 = auVar47._0_4_;
  auVar47 = vmulss_avx512f(auVar68._0_16_,
                           ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x20)));
  uVar32 = auVar47._0_4_;
  uVar37 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar34 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar45 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar35 = uVar37 ^ 0x20;
  auVar66 = vbroadcastss_avx512vl(ZEXT416((uint)(tray->tnear).field_0.i[k]));
  auVar97 = ZEXT3264(auVar66);
  iVar2 = (tray->tfar).field_0.i[k];
  auVar81 = ZEXT3264(CONCAT428(iVar2,CONCAT424(iVar2,CONCAT420(iVar2,CONCAT416(iVar2,CONCAT412(iVar2
                                                  ,CONCAT48(iVar2,CONCAT44(iVar2,iVar2))))))));
  auVar66._8_4_ = 0x80000000;
  auVar66._0_8_ = 0x8000000080000000;
  auVar66._12_4_ = 0x80000000;
  auVar66._16_4_ = 0x80000000;
  auVar66._20_4_ = 0x80000000;
  auVar66._24_4_ = 0x80000000;
  auVar66._28_4_ = 0x80000000;
  auVar66 = vxorps_avx512vl(auVar69,auVar66);
  auVar98 = ZEXT3264(auVar66);
  auVar67._0_8_ = CONCAT44(uVar77,uVar77) ^ 0x8000000080000000;
  auVar67._8_4_ = uVar77 ^ 0x80000000;
  auVar67._12_4_ = uVar77 ^ 0x80000000;
  auVar67._16_4_ = uVar77 ^ 0x80000000;
  auVar67._20_4_ = uVar77 ^ 0x80000000;
  auVar67._24_4_ = uVar77 ^ 0x80000000;
  auVar67._28_4_ = uVar77 ^ 0x80000000;
  auVar88 = ZEXT3264(auVar67);
  auVar68._0_8_ = CONCAT44(uVar32,uVar32) ^ 0x8000000080000000;
  auVar68._8_4_ = uVar32 ^ 0x80000000;
  auVar68._12_4_ = uVar32 ^ 0x80000000;
  auVar68._16_4_ = uVar32 ^ 0x80000000;
  auVar68._20_4_ = uVar32 ^ 0x80000000;
  auVar68._24_4_ = uVar32 ^ 0x80000000;
  auVar68._28_4_ = uVar32 ^ 0x80000000;
  auVar91 = ZEXT3264(auVar68);
  local_2508 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  auVar92 = ZEXT3264(_DAT_01fe9900);
  auVar93 = ZEXT3264(CONCAT428(0xfffffff8,
                               CONCAT424(0xfffffff8,
                                         CONCAT420(0xfffffff8,
                                                   CONCAT416(0xfffffff8,
                                                             CONCAT412(0xfffffff8,
                                                                       CONCAT48(0xfffffff8,
                                                                                0xfffffff8fffffff8))
                                                            )))));
  local_2628 = uVar37;
  do {
    pSVar22 = local_2620 + -1;
    local_2620 = local_2620 + -1;
    if ((float)pSVar22->dist <= *(float *)(ray + k * 4 + 0x80)) {
      sVar44 = (local_2620->ptr).ptr;
      while ((sVar44 & 8) == 0) {
        pauVar24 = (undefined1 (*) [32])(sVar44 & 0xfffffffffffffff0);
        uVar76 = *(undefined4 *)(ray + k * 4 + 0x70);
        auVar72._4_4_ = uVar76;
        auVar72._0_4_ = uVar76;
        auVar72._8_4_ = uVar76;
        auVar72._12_4_ = uVar76;
        auVar72._16_4_ = uVar76;
        auVar72._20_4_ = uVar76;
        auVar72._24_4_ = uVar76;
        auVar72._28_4_ = uVar76;
        auVar47 = vfmadd213ps_fma(*(undefined1 (*) [32])(pauVar24[8] + uVar37),auVar72,
                                  *(undefined1 (*) [32])(pauVar24[2] + uVar37));
        auVar66 = vfmadd213ps_avx512vl(ZEXT1632(auVar47),auVar94._0_32_,auVar98._0_32_);
        auVar69 = vmaxps_avx512vl(auVar97._0_32_,auVar66);
        auVar47 = vfmadd213ps_fma(*(undefined1 (*) [32])(pauVar24[8] + uVar34),auVar72,
                                  *(undefined1 (*) [32])(pauVar24[2] + uVar34));
        auVar64 = vfmadd213ps_fma(*(undefined1 (*) [32])(pauVar24[8] + uVar45),auVar72,
                                  *(undefined1 (*) [32])(pauVar24[2] + uVar45));
        auVar87 = auVar88._0_32_;
        auVar66 = vfmadd213ps_avx512vl(ZEXT1632(auVar47),auVar95._0_32_,auVar87);
        auVar90 = auVar91._0_32_;
        auVar70 = vfmadd213ps_avx512vl(ZEXT1632(auVar64),auVar96._0_32_,auVar90);
        auVar66 = vmaxps_avx(auVar66,auVar70);
        auVar66 = vmaxps_avx(auVar69,auVar66);
        auVar47 = vfmadd213ps_fma(*(undefined1 (*) [32])(pauVar24[8] + uVar35),auVar72,
                                  *(undefined1 (*) [32])(pauVar24[2] + uVar35));
        auVar64 = vfmadd213ps_fma(*(undefined1 (*) [32])(pauVar24[8] + (uVar34 ^ 0x20)),auVar72,
                                  *(undefined1 (*) [32])(pauVar24[2] + (uVar34 ^ 0x20)));
        auVar70 = vfmadd213ps_avx512vl(ZEXT1632(auVar47),auVar94._0_32_,auVar98._0_32_);
        auVar69 = vfmadd213ps_avx512vl(ZEXT1632(auVar64),auVar95._0_32_,auVar87);
        auVar47 = vfmadd213ps_fma(*(undefined1 (*) [32])(pauVar24[8] + (uVar45 ^ 0x20)),auVar72,
                                  *(undefined1 (*) [32])(pauVar24[2] + (uVar45 ^ 0x20)));
        auVar71 = vfmadd213ps_avx512vl(ZEXT1632(auVar47),auVar96._0_32_,auVar90);
        auVar69 = vminps_avx(auVar69,auVar71);
        auVar70 = vminps_avx(auVar81._0_32_,auVar70);
        auVar69 = vminps_avx(auVar70,auVar69);
        uVar46 = vcmpps_avx512vl(auVar66,auVar69,2);
        if (((uint)sVar44 & 7) == 6) {
          uVar26 = vcmpps_avx512vl(auVar72,pauVar24[0xe],0xd);
          uVar27 = vcmpps_avx512vl(auVar72,pauVar24[0xf],1);
          uVar46 = uVar46 & uVar26 & uVar27;
        }
        bVar23 = (byte)uVar46;
        if (bVar23 == 0) goto LAB_0078e7cd;
        auVar69 = *pauVar24;
        auVar70 = pauVar24[1];
        auVar71 = vpternlogd_avx512vl(auVar92._0_32_,auVar66,auVar93._0_32_,0xf8);
        auVar72 = vpcompressd_avx512vl(auVar71);
        auVar74._0_4_ =
             (uint)(bVar23 & 1) * auVar72._0_4_ | (uint)!(bool)(bVar23 & 1) * auVar71._0_4_;
        bVar10 = (bool)((byte)(uVar46 >> 1) & 1);
        auVar74._4_4_ = (uint)bVar10 * auVar72._4_4_ | (uint)!bVar10 * auVar71._4_4_;
        bVar10 = (bool)((byte)(uVar46 >> 2) & 1);
        auVar74._8_4_ = (uint)bVar10 * auVar72._8_4_ | (uint)!bVar10 * auVar71._8_4_;
        bVar10 = (bool)((byte)(uVar46 >> 3) & 1);
        auVar74._12_4_ = (uint)bVar10 * auVar72._12_4_ | (uint)!bVar10 * auVar71._12_4_;
        bVar10 = (bool)((byte)(uVar46 >> 4) & 1);
        auVar74._16_4_ = (uint)bVar10 * auVar72._16_4_ | (uint)!bVar10 * auVar71._16_4_;
        bVar10 = (bool)((byte)(uVar46 >> 5) & 1);
        auVar74._20_4_ = (uint)bVar10 * auVar72._20_4_ | (uint)!bVar10 * auVar71._20_4_;
        bVar10 = (bool)((byte)(uVar46 >> 6) & 1);
        auVar74._24_4_ = (uint)bVar10 * auVar72._24_4_ | (uint)!bVar10 * auVar71._24_4_;
        bVar10 = SUB81(uVar46 >> 7,0);
        auVar74._28_4_ = (uint)bVar10 * auVar72._28_4_ | (uint)!bVar10 * auVar71._28_4_;
        auVar71 = vpermt2q_avx512vl(auVar69,auVar74,auVar70);
        sVar44 = auVar71._0_8_;
        bVar23 = bVar23 - 1 & bVar23;
        if (bVar23 != 0) {
          auVar71 = vpshufd_avx2(auVar74,0x55);
          vpermt2q_avx512vl(auVar69,auVar71,auVar70);
          auVar72 = vpminsd_avx2(auVar74,auVar71);
          auVar71 = vpmaxsd_avx2(auVar74,auVar71);
          bVar23 = bVar23 - 1 & bVar23;
          if (bVar23 == 0) {
            auVar72 = vpermi2q_avx512vl(auVar72,auVar69,auVar70);
            sVar44 = auVar72._0_8_;
            auVar69 = vpermt2q_avx512vl(auVar69,auVar71,auVar70);
            (local_2620->ptr).ptr = auVar69._0_8_;
            auVar66 = vpermd_avx2(auVar71,auVar66);
            local_2620->dist = auVar66._0_4_;
            local_2620 = local_2620 + 1;
          }
          else {
            auVar15 = vpshufd_avx2(auVar74,0xaa);
            vpermt2q_avx512vl(auVar69,auVar15,auVar70);
            auVar75 = vpminsd_avx2(auVar72,auVar15);
            auVar72 = vpmaxsd_avx2(auVar72,auVar15);
            auVar15 = vpminsd_avx2(auVar71,auVar72);
            auVar71 = vpmaxsd_avx2(auVar71,auVar72);
            bVar23 = bVar23 - 1 & bVar23;
            if (bVar23 == 0) {
              auVar72 = vpermi2q_avx512vl(auVar75,auVar69,auVar70);
              sVar44 = auVar72._0_8_;
              auVar72 = vpermt2q_avx512vl(auVar69,auVar71,auVar70);
              (local_2620->ptr).ptr = auVar72._0_8_;
              auVar71 = vpermd_avx2(auVar71,auVar66);
              local_2620->dist = auVar71._0_4_;
              auVar69 = vpermt2q_avx512vl(auVar69,auVar15,auVar70);
              local_2620[1].ptr.ptr = auVar69._0_8_;
              auVar66 = vpermd_avx2(auVar15,auVar66);
              local_2620[1].dist = auVar66._0_4_;
              local_2620 = local_2620 + 2;
            }
            else {
              auVar72 = vpshufd_avx2(auVar74,0xff);
              vpermt2q_avx512vl(auVar69,auVar72,auVar70);
              auVar14 = vpminsd_avx2(auVar75,auVar72);
              auVar72 = vpmaxsd_avx2(auVar75,auVar72);
              auVar75 = vpminsd_avx2(auVar15,auVar72);
              auVar72 = vpmaxsd_avx2(auVar15,auVar72);
              auVar15 = vpminsd_avx2(auVar71,auVar72);
              auVar71 = vpmaxsd_avx2(auVar71,auVar72);
              bVar23 = bVar23 - 1 & bVar23;
              if (bVar23 == 0) {
                auVar72 = vpermi2q_avx512vl(auVar14,auVar69,auVar70);
                sVar44 = auVar72._0_8_;
                auVar72 = vpermt2q_avx512vl(auVar69,auVar71,auVar70);
                (local_2620->ptr).ptr = auVar72._0_8_;
                auVar71 = vpermd_avx2(auVar71,auVar66);
                local_2620->dist = auVar71._0_4_;
                auVar71 = vpermt2q_avx512vl(auVar69,auVar15,auVar70);
                local_2620[1].ptr.ptr = auVar71._0_8_;
                auVar71 = vpermd_avx2(auVar15,auVar66);
                local_2620[1].dist = auVar71._0_4_;
                auVar69 = vpermt2q_avx512vl(auVar69,auVar75,auVar70);
                local_2620[2].ptr.ptr = auVar69._0_8_;
                auVar66 = vpermd_avx2(auVar75,auVar66);
                local_2620[2].dist = auVar66._0_4_;
                local_2620 = local_2620 + 3;
              }
              else {
                auVar73 = valignd_avx512vl(auVar74,auVar74,3);
                auVar72 = vpmovsxbd_avx2(ZEXT816(0x303020108));
                auVar74 = vpermt2d_avx512vl(ZEXT1632(CONCAT412(0x80000000,
                                                               CONCAT48(0x80000000,
                                                                        0x8000000080000000))),
                                            auVar72,auVar14);
                auVar72 = vpmovsxbd_avx2(ZEXT816(0x5040302010008));
                auVar74 = vpermt2d_avx512vl(auVar74,auVar72,auVar75);
                auVar74 = vpermt2d_avx512vl(auVar74,auVar72,auVar15);
                auVar72 = vpmovsxbd_avx2(ZEXT816(0x605040302010008));
                auVar71 = vpermt2d_avx512vl(auVar74,auVar72,auVar71);
                auVar88 = ZEXT3264(auVar71);
                bVar31 = bVar23;
                do {
                  auVar72 = auVar88._0_32_;
                  auVar71._8_4_ = 1;
                  auVar71._0_8_ = 0x100000001;
                  auVar71._12_4_ = 1;
                  auVar71._16_4_ = 1;
                  auVar71._20_4_ = 1;
                  auVar71._24_4_ = 1;
                  auVar71._28_4_ = 1;
                  auVar71 = vpermd_avx2(auVar71,auVar73);
                  auVar73 = valignd_avx512vl(auVar73,auVar73,1);
                  vpermt2q_avx512vl(auVar69,auVar73,auVar70);
                  bVar31 = bVar31 - 1 & bVar31;
                  uVar19 = vpcmpd_avx512vl(auVar71,auVar72,5);
                  auVar71 = vpmaxsd_avx2(auVar71,auVar72);
                  bVar36 = (byte)uVar19 << 1;
                  auVar72 = valignd_avx512vl(auVar72,auVar72,7);
                  bVar10 = (bool)((byte)uVar19 & 1);
                  auVar75._4_4_ = (uint)bVar10 * auVar72._4_4_ | (uint)!bVar10 * auVar71._4_4_;
                  auVar75._0_4_ = auVar71._0_4_;
                  bVar10 = (bool)(bVar36 >> 2 & 1);
                  auVar75._8_4_ = (uint)bVar10 * auVar72._8_4_ | (uint)!bVar10 * auVar71._8_4_;
                  bVar10 = (bool)(bVar36 >> 3 & 1);
                  auVar75._12_4_ = (uint)bVar10 * auVar72._12_4_ | (uint)!bVar10 * auVar71._12_4_;
                  bVar10 = (bool)(bVar36 >> 4 & 1);
                  auVar75._16_4_ = (uint)bVar10 * auVar72._16_4_ | (uint)!bVar10 * auVar71._16_4_;
                  bVar10 = (bool)(bVar36 >> 5 & 1);
                  auVar75._20_4_ = (uint)bVar10 * auVar72._20_4_ | (uint)!bVar10 * auVar71._20_4_;
                  bVar10 = (bool)(bVar36 >> 6 & 1);
                  auVar75._24_4_ = (uint)bVar10 * auVar72._24_4_ | (uint)!bVar10 * auVar71._24_4_;
                  auVar75._28_4_ =
                       (uint)(bVar36 >> 7) * auVar72._28_4_ |
                       (uint)!(bool)(bVar36 >> 7) * auVar71._28_4_;
                  auVar88 = ZEXT3264(auVar75);
                } while (bVar31 != 0);
                lVar25 = (ulong)(uint)POPCOUNT((uint)bVar23) + 3;
                do {
                  auVar71 = vpermi2q_avx512vl(auVar75,auVar69,auVar70);
                  (local_2620->ptr).ptr = auVar71._0_8_;
                  auVar72 = auVar88._0_32_;
                  auVar71 = vpermd_avx2(auVar72,auVar66);
                  local_2620->dist = auVar71._0_4_;
                  auVar75 = valignd_avx512vl(auVar72,auVar72,1);
                  local_2620 = local_2620 + 1;
                  auVar88 = ZEXT3264(auVar75);
                  lVar25 = lVar25 + -1;
                } while (lVar25 != 0);
                auVar66 = vpermt2q_avx512vl(auVar69,auVar75,auVar70);
                sVar44 = auVar66._0_8_;
              }
              auVar88 = ZEXT3264(auVar87);
              auVar91 = ZEXT3264(auVar90);
              auVar92 = ZEXT3264(auVar92._0_32_);
              auVar93 = ZEXT3264(auVar93._0_32_);
            }
          }
        }
      }
      local_2610 = (ulong)((uint)sVar44 & 0xf) - 8;
      if (local_2610 != 0) {
        uVar37 = sVar44 & 0xfffffffffffffff0;
        lVar25 = 0;
        do {
          lVar42 = lVar25 * 0x50;
          local_2618 = context->scene;
          pGVar5 = (local_2618->geometries).items[*(uint *)(uVar37 + 0x30 + lVar42)].ptr;
          fVar89 = (pGVar5->time_range).lower;
          fVar89 = pGVar5->fnumTimeSegments *
                   ((*(float *)(ray + k * 4 + 0x70) - fVar89) /
                   ((pGVar5->time_range).upper - fVar89));
          auVar47 = vroundss_avx(ZEXT416((uint)fVar89),ZEXT416((uint)fVar89),9);
          auVar47 = vminss_avx(auVar47,ZEXT416((uint)(pGVar5->fnumTimeSegments + -1.0)));
          auVar11 = vmaxss_avx(ZEXT816(0) << 0x20,auVar47);
          lVar33 = (long)(int)auVar11._0_4_ * 0x38;
          lVar6 = *(long *)(*(long *)&pGVar5[2].numPrimitives + lVar33);
          auVar47 = *(undefined1 (*) [16])(lVar6 + (ulong)*(uint *)(uVar37 + lVar42) * 4);
          uVar46 = CONCAT44(0,*(uint *)(uVar37 + 0x10 + lVar42));
          local_2478._0_8_ = uVar46;
          auVar64 = *(undefined1 (*) [16])(lVar6 + uVar46 * 4);
          uVar26 = CONCAT44(0,*(uint *)(uVar37 + 0x20 + lVar42));
          local_2498._0_8_ = uVar26;
          auVar86 = *(undefined1 (*) [16])(lVar6 + uVar26 * 4);
          uVar27 = CONCAT44(0,*(uint *)(uVar37 + 4 + lVar42));
          local_24b8._0_8_ = uVar27;
          auVar48 = *(undefined1 (*) [16])(lVar6 + uVar27 * 4);
          uVar28 = CONCAT44(0,*(uint *)(uVar37 + 0x14 + lVar42));
          local_24d8._0_8_ = uVar28;
          auVar59 = *(undefined1 (*) [16])(lVar6 + uVar28 * 4);
          uVar29 = CONCAT44(0,*(uint *)(uVar37 + 0x24 + lVar42));
          local_24f8._0_8_ = uVar29;
          auVar61 = *(undefined1 (*) [16])(lVar6 + uVar29 * 4);
          uVar30 = (ulong)*(uint *)(uVar37 + 8 + lVar42);
          auVar49 = *(undefined1 (*) [16])(lVar6 + uVar30 * 4);
          uVar43 = (ulong)*(uint *)(uVar37 + 0x18 + lVar42);
          auVar51 = *(undefined1 (*) [16])(lVar6 + uVar43 * 4);
          uVar41 = (ulong)*(uint *)(uVar37 + 0x28 + lVar42);
          auVar62 = *(undefined1 (*) [16])(lVar6 + uVar41 * 4);
          uVar40 = (ulong)*(uint *)(uVar37 + 0xc + lVar42);
          auVar63 = *(undefined1 (*) [16])(lVar6 + uVar40 * 4);
          uVar39 = (ulong)*(uint *)(uVar37 + 0x1c + lVar42);
          auVar60 = *(undefined1 (*) [16])(lVar6 + uVar39 * 4);
          lVar33 = *(long *)(*(long *)&pGVar5[2].numPrimitives + 0x38 + lVar33);
          uVar38 = (ulong)*(uint *)(uVar37 + 0x2c + lVar42);
          auVar50 = *(undefined1 (*) [16])(lVar6 + uVar38 * 4);
          auVar52 = *(undefined1 (*) [16])(lVar33 + (ulong)*(uint *)(uVar37 + lVar42) * 4);
          auVar53 = *(undefined1 (*) [16])(lVar33 + uVar46 * 4);
          auVar56 = *(undefined1 (*) [16])(lVar33 + uVar26 * 4);
          auVar54 = *(undefined1 (*) [16])(lVar33 + uVar27 * 4);
          auVar55 = *(undefined1 (*) [16])(lVar33 + uVar28 * 4);
          auVar57 = *(undefined1 (*) [16])(lVar33 + uVar29 * 4);
          auVar58 = *(undefined1 (*) [16])(lVar33 + uVar30 * 4);
          auVar78 = *(undefined1 (*) [16])(lVar33 + uVar43 * 4);
          auVar80 = *(undefined1 (*) [16])(lVar33 + uVar41 * 4);
          auVar65 = *(undefined1 (*) [16])(lVar33 + uVar40 * 4);
          auVar79 = *(undefined1 (*) [16])(lVar33 + uVar39 * 4);
          auVar4 = *(undefined1 (*) [16])(lVar33 + uVar38 * 4);
          puVar1 = (undefined8 *)(uVar37 + 0x30 + lVar42);
          local_2458 = *puVar1;
          uStack_2450 = puVar1[1];
          puVar1 = (undefined8 *)(uVar37 + 0x40 + lVar42);
          auVar12 = vunpcklps_avx(auVar47,auVar49);
          auVar47 = vunpckhps_avx(auVar47,auVar49);
          auVar49 = vunpcklps_avx(auVar48,auVar63);
          auVar48 = vunpckhps_avx(auVar48,auVar63);
          auVar63 = vunpcklps_avx(auVar47,auVar48);
          auVar13 = vunpcklps_avx(auVar12,auVar49);
          auVar47 = vunpckhps_avx(auVar12,auVar49);
          auVar49 = vunpcklps_avx(auVar64,auVar51);
          auVar64 = vunpckhps_avx(auVar64,auVar51);
          auVar51 = vunpcklps_avx(auVar59,auVar60);
          auVar48 = vunpckhps_avx(auVar59,auVar60);
          auVar59 = vunpcklps_avx(auVar64,auVar48);
          auVar60 = vunpcklps_avx(auVar49,auVar51);
          auVar64 = vunpckhps_avx(auVar49,auVar51);
          auVar49 = vunpcklps_avx(auVar86,auVar62);
          auVar86 = vunpckhps_avx(auVar86,auVar62);
          auVar51 = vunpcklps_avx(auVar61,auVar50);
          auVar48 = vunpckhps_avx(auVar61,auVar50);
          auVar61 = vunpcklps_avx(auVar86,auVar48);
          auVar62 = vunpcklps_avx(auVar49,auVar51);
          auVar86 = vunpckhps_avx(auVar49,auVar51);
          auVar48 = vunpcklps_avx512vl(auVar52,auVar58);
          auVar49 = vunpckhps_avx512vl(auVar52,auVar58);
          auVar50 = vunpcklps_avx512vl(auVar54,auVar65);
          auVar51 = vunpckhps_avx512vl(auVar54,auVar65);
          auVar49 = vunpcklps_avx(auVar49,auVar51);
          auVar51 = vunpcklps_avx(auVar48,auVar50);
          auVar48 = vunpckhps_avx(auVar48,auVar50);
          auVar50 = vunpcklps_avx512vl(auVar53,auVar78);
          auVar52 = vunpckhps_avx512vl(auVar53,auVar78);
          auVar53 = vunpcklps_avx512vl(auVar55,auVar79);
          auVar54 = vunpckhps_avx512vl(auVar55,auVar79);
          auVar52 = vunpcklps_avx512vl(auVar52,auVar54);
          auVar54 = vunpcklps_avx512vl(auVar50,auVar53);
          auVar53 = vunpckhps_avx512vl(auVar50,auVar53);
          auVar55 = vunpcklps_avx512vl(auVar56,auVar80);
          auVar50 = vunpckhps_avx512vl(auVar56,auVar80);
          auVar56 = vunpcklps_avx512vl(auVar57,auVar4);
          auVar57 = vunpckhps_avx512vl(auVar57,auVar4);
          auVar50 = vunpcklps_avx(auVar50,auVar57);
          auVar57 = vunpcklps_avx512vl(auVar55,auVar56);
          auVar56 = vunpckhps_avx512vl(auVar55,auVar56);
          auVar58 = ZEXT416((uint)(fVar89 - auVar11._0_4_));
          auVar55 = vbroadcastss_avx512vl(auVar58);
          auVar58 = vsubss_avx512f(ZEXT416(0x3f800000),auVar58);
          auVar78._0_4_ = auVar58._0_4_;
          auVar78._4_4_ = auVar78._0_4_;
          auVar78._8_4_ = auVar78._0_4_;
          auVar78._12_4_ = auVar78._0_4_;
          auVar51 = vmulps_avx512vl(auVar55,auVar51);
          auVar48 = vmulps_avx512vl(auVar55,auVar48);
          auVar58 = vmulps_avx512vl(auVar55,auVar49);
          auVar49 = vfmadd231ps_fma(auVar51,auVar78,auVar13);
          auVar51 = vfmadd231ps_fma(auVar48,auVar78,auVar47);
          auVar63 = vfmadd231ps_fma(auVar58,auVar78,auVar63);
          auVar47 = vmulps_avx512vl(auVar55,auVar54);
          auVar48 = vmulps_avx512vl(auVar55,auVar53);
          auVar52 = vmulps_avx512vl(auVar55,auVar52);
          auVar47 = vfmadd231ps_fma(auVar47,auVar78,auVar60);
          auVar64 = vfmadd231ps_fma(auVar48,auVar78,auVar64);
          auVar48 = vfmadd231ps_fma(auVar52,auVar78,auVar59);
          auVar59 = vmulps_avx512vl(auVar55,auVar57);
          auVar60 = vmulps_avx512vl(auVar55,auVar56);
          auVar50 = vmulps_avx512vl(auVar55,auVar50);
          auVar59 = vfmadd231ps_fma(auVar59,auVar78,auVar62);
          auVar62 = vfmadd231ps_fma(auVar60,auVar78,auVar86);
          auVar61 = vfmadd231ps_fma(auVar50,auVar78,auVar61);
          local_25d8 = *puVar1;
          uStack_25d0 = puVar1[1];
          auVar47 = vsubps_avx(auVar49,auVar47);
          auVar64 = vsubps_avx(auVar51,auVar64);
          auVar86 = vsubps_avx(auVar63,auVar48);
          auVar48 = vsubps_avx(auVar59,auVar49);
          auVar59 = vsubps_avx(auVar62,auVar51);
          auVar60 = vsubps_avx512vl(auVar61,auVar63);
          auVar61 = vmulps_avx512vl(auVar64,auVar60);
          local_2548 = vfmsub231ps_fma(auVar61,auVar59,auVar86);
          auVar50._0_4_ = auVar86._0_4_ * auVar48._0_4_;
          auVar50._4_4_ = auVar86._4_4_ * auVar48._4_4_;
          auVar50._8_4_ = auVar86._8_4_ * auVar48._8_4_;
          auVar50._12_4_ = auVar86._12_4_ * auVar48._12_4_;
          local_2538 = vfmsub231ps_avx512vl(auVar50,auVar60,auVar47);
          auVar52._0_4_ = auVar47._0_4_ * auVar59._0_4_;
          auVar52._4_4_ = auVar47._4_4_ * auVar59._4_4_;
          auVar52._8_4_ = auVar47._8_4_ * auVar59._8_4_;
          auVar52._12_4_ = auVar47._12_4_ * auVar59._12_4_;
          fVar89 = *(float *)(ray + k * 4 + 0x40);
          auVar53._4_4_ = fVar89;
          auVar53._0_4_ = fVar89;
          auVar53._8_4_ = fVar89;
          auVar53._12_4_ = fVar89;
          fVar82 = *(float *)(ray + k * 4 + 0x50);
          auVar56._4_4_ = fVar82;
          auVar56._0_4_ = fVar82;
          auVar56._8_4_ = fVar82;
          auVar56._12_4_ = fVar82;
          auVar62 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x60)));
          uVar76 = *(undefined4 *)(ray + k * 4);
          auVar61._4_4_ = uVar76;
          auVar61._0_4_ = uVar76;
          auVar61._8_4_ = uVar76;
          auVar61._12_4_ = uVar76;
          auVar50 = vsubps_avx512vl(auVar49,auVar61);
          local_2528 = vfmsub231ps_fma(auVar52,auVar48,auVar64);
          uVar76 = *(undefined4 *)(ray + k * 4 + 0x10);
          auVar49._4_4_ = uVar76;
          auVar49._0_4_ = uVar76;
          auVar49._8_4_ = uVar76;
          auVar49._12_4_ = uVar76;
          auVar52 = vsubps_avx512vl(auVar51,auVar49);
          uVar76 = *(undefined4 *)(ray + k * 4 + 0x20);
          auVar51._4_4_ = uVar76;
          auVar51._0_4_ = uVar76;
          auVar51._8_4_ = uVar76;
          auVar51._12_4_ = uVar76;
          auVar51 = vsubps_avx512vl(auVar63,auVar51);
          auVar63._0_4_ = fVar82 * auVar51._0_4_;
          auVar63._4_4_ = fVar82 * auVar51._4_4_;
          auVar63._8_4_ = fVar82 * auVar51._8_4_;
          auVar63._12_4_ = fVar82 * auVar51._12_4_;
          auVar63 = vfmsub231ps_avx512vl(auVar63,auVar52,auVar62);
          auVar61 = vmulps_avx512vl(auVar62,auVar50);
          auVar61 = vfmsub231ps_fma(auVar61,auVar51,auVar53);
          auVar55._0_4_ = fVar89 * auVar52._0_4_;
          auVar55._4_4_ = fVar89 * auVar52._4_4_;
          auVar55._8_4_ = fVar89 * auVar52._8_4_;
          auVar55._12_4_ = fVar89 * auVar52._12_4_;
          auVar49 = vfmsub231ps_fma(auVar55,auVar50,auVar56);
          auVar62 = vmulps_avx512vl(local_2528,auVar62);
          auVar62 = vfmadd231ps_avx512vl(auVar62,local_2538,auVar56);
          auVar53 = vfmadd231ps_avx512vl(auVar62,local_2548,auVar53);
          auVar62._8_4_ = 0x7fffffff;
          auVar62._0_8_ = 0x7fffffff7fffffff;
          auVar62._12_4_ = 0x7fffffff;
          local_2598 = vandps_avx512vl(auVar53,auVar62);
          auVar54._8_4_ = 0x80000000;
          auVar54._0_8_ = 0x8000000080000000;
          auVar54._12_4_ = 0x80000000;
          auVar62 = vandps_avx512vl(auVar53,auVar54);
          auVar60 = vmulps_avx512vl(auVar60,auVar49);
          auVar59 = vfmadd231ps_avx512vl(auVar60,auVar61,auVar59);
          auVar48 = vfmadd231ps_avx512vl(auVar59,auVar63,auVar48);
          local_25c8 = vxorps_avx512vl(auVar62,auVar48);
          auVar48._0_4_ = auVar86._0_4_ * auVar49._0_4_;
          auVar48._4_4_ = auVar86._4_4_ * auVar49._4_4_;
          auVar48._8_4_ = auVar86._8_4_ * auVar49._8_4_;
          auVar48._12_4_ = auVar86._12_4_ * auVar49._12_4_;
          auVar64 = vfmadd231ps_fma(auVar48,auVar64,auVar61);
          auVar47 = vfmadd231ps_fma(auVar64,auVar47,auVar63);
          local_25b8._0_4_ = (float)(auVar62._0_4_ ^ auVar47._0_4_);
          local_25b8._4_4_ = (float)(auVar62._4_4_ ^ auVar47._4_4_);
          local_25b8._8_4_ = (float)(auVar62._8_4_ ^ auVar47._8_4_);
          local_25b8._12_4_ = (float)(auVar62._12_4_ ^ auVar47._12_4_);
          auVar47 = ZEXT816(0) << 0x20;
          uVar19 = vcmpps_avx512vl(local_25c8,auVar47,5);
          uVar16 = vcmpps_avx512vl(local_25b8,auVar47,5);
          uVar17 = vcmpps_avx512vl(auVar53,auVar47,4);
          auVar47._0_4_ = local_25c8._0_4_ + local_25b8._0_4_;
          auVar47._4_4_ = local_25c8._4_4_ + local_25b8._4_4_;
          auVar47._8_4_ = local_25c8._8_4_ + local_25b8._8_4_;
          auVar47._12_4_ = local_25c8._12_4_ + local_25b8._12_4_;
          uVar18 = vcmpps_avx512vl(auVar47,local_2598,2);
          bVar23 = (byte)uVar19 & (byte)uVar16 & (byte)uVar17 & (byte)uVar18;
          if (bVar23 != 0) {
            auVar86._0_4_ = auVar51._0_4_ * local_2528._0_4_;
            auVar86._4_4_ = auVar51._4_4_ * local_2528._4_4_;
            auVar86._8_4_ = auVar51._8_4_ * local_2528._8_4_;
            auVar86._12_4_ = auVar51._12_4_ * local_2528._12_4_;
            auVar47 = vfmadd213ps_fma(auVar52,local_2538,auVar86);
            auVar47 = vfmadd213ps_fma(auVar50,local_2548,auVar47);
            uVar76 = *(undefined4 *)(ray + k * 4 + 0x30);
            auVar64._4_4_ = uVar76;
            auVar64._0_4_ = uVar76;
            auVar64._8_4_ = uVar76;
            auVar64._12_4_ = uVar76;
            auVar64 = vmulps_avx512vl(local_2598,auVar64);
            fVar89 = *(float *)(ray + k * 4 + 0x80);
            local_25a8._0_4_ = (float)(auVar62._0_4_ ^ auVar47._0_4_);
            local_25a8._4_4_ = (float)(auVar62._4_4_ ^ auVar47._4_4_);
            local_25a8._8_4_ = (float)(auVar62._8_4_ ^ auVar47._8_4_);
            local_25a8._12_4_ = (float)(auVar62._12_4_ ^ auVar47._12_4_);
            auVar59._0_4_ = fVar89 * local_2598._0_4_;
            auVar59._4_4_ = fVar89 * local_2598._4_4_;
            auVar59._8_4_ = fVar89 * local_2598._8_4_;
            auVar59._12_4_ = fVar89 * local_2598._12_4_;
            uVar19 = vcmpps_avx512vl(local_25a8,auVar59,2);
            uVar16 = vcmpps_avx512vl(auVar64,local_25a8,1);
            bVar23 = (byte)uVar19 & (byte)uVar16 & bVar23;
            if (bVar23 != 0) {
              local_2587 = bVar23;
              auVar47 = vrcp14ps_avx512vl(local_2598);
              auVar60._8_4_ = 0x3f800000;
              auVar60._0_8_ = 0x3f8000003f800000;
              auVar60._12_4_ = 0x3f800000;
              auVar64 = vfnmadd213ps_avx512vl(local_2598,auVar47,auVar60);
              auVar47 = vfmadd132ps_fma(auVar64,auVar47,auVar47);
              fVar82 = auVar47._0_4_;
              local_2558._0_4_ = fVar82 * local_25a8._0_4_;
              fVar83 = auVar47._4_4_;
              local_2558._4_4_ = fVar83 * local_25a8._4_4_;
              fVar84 = auVar47._8_4_;
              local_2558._8_4_ = fVar84 * local_25a8._8_4_;
              fVar85 = auVar47._12_4_;
              local_2558._12_4_ = fVar85 * local_25a8._12_4_;
              auVar81 = ZEXT1664(local_2558);
              local_2578[0] = fVar82 * local_25c8._0_4_;
              local_2578[1] = fVar83 * local_25c8._4_4_;
              local_2578[2] = fVar84 * local_25c8._8_4_;
              local_2578[3] = fVar85 * local_25c8._12_4_;
              local_2568[0] = fVar82 * local_25b8._0_4_;
              local_2568[1] = fVar83 * local_25b8._4_4_;
              local_2568[2] = fVar84 * local_25b8._8_4_;
              local_2568[3] = fVar85 * local_25b8._12_4_;
              auVar58._8_4_ = 0x7f800000;
              auVar58._0_8_ = 0x7f8000007f800000;
              auVar58._12_4_ = 0x7f800000;
              auVar47 = vblendmps_avx512vl(auVar58,local_2558);
              auVar57._0_4_ =
                   (uint)(bVar23 & 1) * auVar47._0_4_ | (uint)!(bool)(bVar23 & 1) * 0x7f800000;
              bVar10 = (bool)(bVar23 >> 1 & 1);
              auVar57._4_4_ = (uint)bVar10 * auVar47._4_4_ | (uint)!bVar10 * 0x7f800000;
              bVar10 = (bool)(bVar23 >> 2 & 1);
              auVar57._8_4_ = (uint)bVar10 * auVar47._8_4_ | (uint)!bVar10 * 0x7f800000;
              bVar10 = (bool)(bVar23 >> 3 & 1);
              auVar57._12_4_ = (uint)bVar10 * auVar47._12_4_ | (uint)!bVar10 * 0x7f800000;
              auVar47 = vshufps_avx(auVar57,auVar57,0xb1);
              auVar47 = vminps_avx(auVar47,auVar57);
              auVar64 = vshufpd_avx(auVar47,auVar47,1);
              auVar47 = vminps_avx(auVar64,auVar47);
              uVar19 = vcmpps_avx512vl(auVar57,auVar47,0);
              bVar31 = (byte)uVar19 & bVar23;
              do {
                bVar36 = bVar23;
                if (bVar31 != 0) {
                  bVar36 = bVar31;
                }
                uVar77 = 0;
                for (uVar32 = (uint)bVar36; (uVar32 & 1) == 0; uVar32 = uVar32 >> 1 | 0x80000000) {
                  uVar77 = uVar77 + 1;
                }
                local_2630 = (ulong)uVar77;
                uVar32 = *(uint *)((long)&local_2458 + local_2630 * 4);
                local_2638 = (local_2618->geometries).items[uVar32].ptr;
                if ((local_2638->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                  bVar23 = ~(byte)(1 << (uVar77 & 0x1f)) & bVar23;
                }
                else {
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (local_2638->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    uVar46 = (ulong)(uVar77 << 2);
                    uVar76 = *(undefined4 *)((long)local_2578 + uVar46);
                    uVar3 = *(undefined4 *)((long)local_2568 + uVar46);
                    *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_2558 + uVar46);
                    *(undefined4 *)(ray + k * 4 + 0xc0) = *(undefined4 *)(local_2548 + uVar46);
                    *(undefined4 *)(ray + k * 4 + 0xd0) = *(undefined4 *)(local_2538 + uVar46);
                    *(undefined4 *)(ray + k * 4 + 0xe0) = *(undefined4 *)(local_2528 + uVar46);
                    *(undefined4 *)(ray + k * 4 + 0xf0) = uVar76;
                    *(undefined4 *)(ray + k * 4 + 0x100) = uVar3;
                    *(undefined4 *)(ray + k * 4 + 0x110) =
                         *(undefined4 *)((long)&local_25d8 + uVar46);
                    *(uint *)(ray + k * 4 + 0x120) = uVar32;
                    *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                    break;
                  }
                  local_2518 = auVar81._0_16_;
                  local_24f8 = auVar98._0_32_;
                  local_24d8 = auVar97._0_32_;
                  local_24b8 = auVar96._0_32_;
                  local_2498 = auVar95._0_32_;
                  local_2478 = auVar94._0_32_;
                  uVar46 = (ulong)(uVar77 * 4);
                  uVar76 = *(undefined4 *)((long)local_2578 + uVar46);
                  h.u.field_0.i[1] = uVar76;
                  h.u.field_0.i[0] = uVar76;
                  h.u.field_0.i[2] = uVar76;
                  h.u.field_0.i[3] = uVar76;
                  h.v.field_0.v[0] = *(float *)((long)local_2568 + uVar46);
                  h.geomID.field_0 =
                       (anon_union_16_2_9473010e_for_vuint_impl<4>_1)vpbroadcastd_avx512vl();
                  uVar76 = *(undefined4 *)((long)&local_25d8 + uVar46);
                  h.primID.field_0.i[1] = uVar76;
                  h.primID.field_0.i[0] = uVar76;
                  h.primID.field_0.i[2] = uVar76;
                  h.primID.field_0.i[3] = uVar76;
                  uVar76 = *(undefined4 *)(local_2548 + uVar46);
                  h.Ng.field_0._4_4_ = uVar76;
                  h.Ng.field_0._0_4_ = uVar76;
                  h.Ng.field_0._8_4_ = uVar76;
                  h.Ng.field_0._12_4_ = uVar76;
                  h.Ng.field_0._16_4_ = *(undefined4 *)(local_2538 + uVar46);
                  uVar76 = *(undefined4 *)(local_2528 + uVar46);
                  h.Ng.field_0._36_4_ = uVar76;
                  h.Ng.field_0._32_4_ = uVar76;
                  h.Ng.field_0._40_4_ = uVar76;
                  h.Ng.field_0._44_4_ = uVar76;
                  h.Ng.field_0._20_4_ = h.Ng.field_0._16_4_;
                  h.Ng.field_0._24_4_ = h.Ng.field_0._16_4_;
                  h.Ng.field_0._28_4_ = h.Ng.field_0._16_4_;
                  h.v.field_0.v[1] = h.v.field_0.v[0];
                  h.v.field_0.v[2] = h.v.field_0.v[0];
                  h.v.field_0.v[3] = h.v.field_0.v[0];
                  vpcmpeqd_avx2(ZEXT1632((undefined1  [16])h.u.field_0),
                                ZEXT1632((undefined1  [16])h.u.field_0));
                  h.instID[0].field_0.i[1] = context->user->instID[0];
                  h.instID[0].field_0.i[0] = h.instID[0].field_0.i[1];
                  h.instID[0].field_0.i[2] = h.instID[0].field_0.i[1];
                  h.instID[0].field_0.i[3] = h.instID[0].field_0.i[1];
                  h.instPrimID[0].field_0.i[0] = context->user->instPrimID[0];
                  h.instPrimID[0].field_0.i[1] = h.instPrimID[0].field_0.i[0];
                  h.instPrimID[0].field_0.i[2] = h.instPrimID[0].field_0.i[0];
                  h.instPrimID[0].field_0.i[3] = h.instPrimID[0].field_0.i[0];
                  *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_2558 + uVar46);
                  local_2648 = local_2508;
                  args.valid = (int *)local_2648;
                  args.geometryUserPtr = local_2638->userPtr;
                  args.context = context->user;
                  args.hit = (RTCHitN *)&h;
                  args.N = 4;
                  args.ray = (RTCRayN *)ray;
                  if (local_2638->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                    (*local_2638->intersectionFilterN)(&args);
                  }
                  uVar46 = vptestmd_avx512vl(local_2648,local_2648);
                  if ((uVar46 & 0xf) == 0) {
LAB_0078e645:
                    *(float *)(ray + k * 4 + 0x80) = fVar89;
                  }
                  else {
                    p_Var7 = context->args->filter;
                    if ((p_Var7 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((local_2638->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var7)(&args);
                    }
                    uVar46 = vptestmd_avx512vl(local_2648,local_2648);
                    uVar46 = uVar46 & 0xf;
                    bVar31 = (byte)uVar46;
                    if (bVar31 == 0) goto LAB_0078e645;
                    iVar2 = *(int *)(args.hit + 4);
                    iVar20 = *(int *)(args.hit + 8);
                    iVar21 = *(int *)(args.hit + 0xc);
                    bVar10 = (bool)((byte)(uVar46 >> 1) & 1);
                    bVar8 = (bool)((byte)(uVar46 >> 2) & 1);
                    bVar9 = SUB81(uVar46 >> 3,0);
                    *(uint *)(args.ray + 0xc0) =
                         (uint)(bVar31 & 1) * *(int *)args.hit |
                         (uint)!(bool)(bVar31 & 1) * *(uint *)(args.ray + 0xc0);
                    *(uint *)(args.ray + 0xc4) =
                         (uint)bVar10 * iVar2 | (uint)!bVar10 * *(int *)(args.ray + 0xc4);
                    *(uint *)(args.ray + 200) =
                         (uint)bVar8 * iVar20 | (uint)!bVar8 * *(int *)(args.ray + 200);
                    *(uint *)(args.ray + 0xcc) =
                         (uint)bVar9 * iVar21 | (uint)!bVar9 * *(int *)(args.ray + 0xcc);
                    iVar2 = *(int *)(args.hit + 0x14);
                    iVar20 = *(int *)(args.hit + 0x18);
                    iVar21 = *(int *)(args.hit + 0x1c);
                    bVar10 = (bool)((byte)(uVar46 >> 1) & 1);
                    bVar8 = (bool)((byte)(uVar46 >> 2) & 1);
                    bVar9 = SUB81(uVar46 >> 3,0);
                    *(uint *)(args.ray + 0xd0) =
                         (uint)(bVar31 & 1) * *(int *)(args.hit + 0x10) |
                         (uint)!(bool)(bVar31 & 1) * *(uint *)(args.ray + 0xd0);
                    *(uint *)(args.ray + 0xd4) =
                         (uint)bVar10 * iVar2 | (uint)!bVar10 * *(int *)(args.ray + 0xd4);
                    *(uint *)(args.ray + 0xd8) =
                         (uint)bVar8 * iVar20 | (uint)!bVar8 * *(int *)(args.ray + 0xd8);
                    *(uint *)(args.ray + 0xdc) =
                         (uint)bVar9 * iVar21 | (uint)!bVar9 * *(int *)(args.ray + 0xdc);
                    iVar2 = *(int *)(args.hit + 0x24);
                    iVar20 = *(int *)(args.hit + 0x28);
                    iVar21 = *(int *)(args.hit + 0x2c);
                    bVar10 = (bool)((byte)(uVar46 >> 1) & 1);
                    bVar8 = (bool)((byte)(uVar46 >> 2) & 1);
                    bVar9 = SUB81(uVar46 >> 3,0);
                    *(uint *)(args.ray + 0xe0) =
                         (uint)(bVar31 & 1) * *(int *)(args.hit + 0x20) |
                         (uint)!(bool)(bVar31 & 1) * *(uint *)(args.ray + 0xe0);
                    *(uint *)(args.ray + 0xe4) =
                         (uint)bVar10 * iVar2 | (uint)!bVar10 * *(int *)(args.ray + 0xe4);
                    *(uint *)(args.ray + 0xe8) =
                         (uint)bVar8 * iVar20 | (uint)!bVar8 * *(int *)(args.ray + 0xe8);
                    *(uint *)(args.ray + 0xec) =
                         (uint)bVar9 * iVar21 | (uint)!bVar9 * *(int *)(args.ray + 0xec);
                    iVar2 = *(int *)(args.hit + 0x34);
                    iVar20 = *(int *)(args.hit + 0x38);
                    iVar21 = *(int *)(args.hit + 0x3c);
                    bVar10 = (bool)((byte)(uVar46 >> 1) & 1);
                    bVar8 = (bool)((byte)(uVar46 >> 2) & 1);
                    bVar9 = SUB81(uVar46 >> 3,0);
                    *(uint *)(args.ray + 0xf0) =
                         (uint)(bVar31 & 1) * *(int *)(args.hit + 0x30) |
                         (uint)!(bool)(bVar31 & 1) * *(uint *)(args.ray + 0xf0);
                    *(uint *)(args.ray + 0xf4) =
                         (uint)bVar10 * iVar2 | (uint)!bVar10 * *(int *)(args.ray + 0xf4);
                    *(uint *)(args.ray + 0xf8) =
                         (uint)bVar8 * iVar20 | (uint)!bVar8 * *(int *)(args.ray + 0xf8);
                    *(uint *)(args.ray + 0xfc) =
                         (uint)bVar9 * iVar21 | (uint)!bVar9 * *(int *)(args.ray + 0xfc);
                    iVar2 = *(int *)(args.hit + 0x44);
                    iVar20 = *(int *)(args.hit + 0x48);
                    iVar21 = *(int *)(args.hit + 0x4c);
                    bVar10 = (bool)((byte)(uVar46 >> 1) & 1);
                    bVar8 = (bool)((byte)(uVar46 >> 2) & 1);
                    bVar9 = SUB81(uVar46 >> 3,0);
                    *(uint *)(args.ray + 0x100) =
                         (uint)(bVar31 & 1) * *(int *)(args.hit + 0x40) |
                         (uint)!(bool)(bVar31 & 1) * *(uint *)(args.ray + 0x100);
                    *(uint *)(args.ray + 0x104) =
                         (uint)bVar10 * iVar2 | (uint)!bVar10 * *(int *)(args.ray + 0x104);
                    *(uint *)(args.ray + 0x108) =
                         (uint)bVar8 * iVar20 | (uint)!bVar8 * *(int *)(args.ray + 0x108);
                    *(uint *)(args.ray + 0x10c) =
                         (uint)bVar9 * iVar21 | (uint)!bVar9 * *(int *)(args.ray + 0x10c);
                    auVar47 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(args.hit + 0x50));
                    *(undefined1 (*) [16])(args.ray + 0x110) = auVar47;
                    auVar47 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(args.hit + 0x60));
                    *(undefined1 (*) [16])(args.ray + 0x120) = auVar47;
                    auVar47 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(args.hit + 0x70));
                    *(undefined1 (*) [16])(args.ray + 0x130) = auVar47;
                    auVar47 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(args.hit + 0x80));
                    *(undefined1 (*) [16])(args.ray + 0x140) = auVar47;
                    fVar89 = *(float *)(ray + k * 4 + 0x80);
                  }
                  auVar80._4_4_ = fVar89;
                  auVar80._0_4_ = fVar89;
                  auVar80._8_4_ = fVar89;
                  auVar80._12_4_ = fVar89;
                  auVar81 = ZEXT1664(local_2518);
                  uVar19 = vcmpps_avx512vl(local_2518,auVar80,2);
                  bVar23 = ~(byte)(1 << ((uint)local_2630 & 0x1f)) & bVar23 & (byte)uVar19;
                  auVar94 = ZEXT3264(local_2478);
                  auVar95 = ZEXT3264(local_2498);
                  auVar96 = ZEXT3264(local_24b8);
                  auVar97 = ZEXT3264(local_24d8);
                  auVar98 = ZEXT3264(local_24f8);
                }
                if (bVar23 == 0) break;
                auVar79._8_4_ = 0x7f800000;
                auVar79._0_8_ = 0x7f8000007f800000;
                auVar79._12_4_ = 0x7f800000;
                auVar47 = vblendmps_avx512vl(auVar79,auVar81._0_16_);
                auVar65._0_4_ =
                     (uint)(bVar23 & 1) * auVar47._0_4_ | (uint)!(bool)(bVar23 & 1) * 0x7f800000;
                bVar10 = (bool)(bVar23 >> 1 & 1);
                auVar65._4_4_ = (uint)bVar10 * auVar47._4_4_ | (uint)!bVar10 * 0x7f800000;
                bVar10 = (bool)(bVar23 >> 2 & 1);
                auVar65._8_4_ = (uint)bVar10 * auVar47._8_4_ | (uint)!bVar10 * 0x7f800000;
                bVar10 = (bool)(bVar23 >> 3 & 1);
                auVar65._12_4_ = (uint)bVar10 * auVar47._12_4_ | (uint)!bVar10 * 0x7f800000;
                auVar47 = vshufps_avx(auVar65,auVar65,0xb1);
                auVar47 = vminps_avx(auVar47,auVar65);
                auVar64 = vshufpd_avx(auVar47,auVar47,1);
                auVar47 = vminps_avx(auVar64,auVar47);
                uVar19 = vcmpps_avx512vl(auVar65,auVar47,0);
                bVar31 = (byte)uVar19 & bVar23;
              } while( true );
            }
          }
          lVar25 = lVar25 + 1;
        } while (lVar25 != local_2610);
      }
      uVar76 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar81 = ZEXT3264(CONCAT428(uVar76,CONCAT424(uVar76,CONCAT420(uVar76,CONCAT416(uVar76,
                                                  CONCAT412(uVar76,CONCAT48(uVar76,CONCAT44(uVar76,
                                                  uVar76))))))));
      auVar88 = ZEXT3264(auVar67);
      auVar91 = ZEXT3264(auVar68);
      auVar92 = ZEXT3264(_DAT_01fe9900);
      auVar93 = ZEXT3264(CONCAT428(0xfffffff8,
                                   CONCAT424(0xfffffff8,
                                             CONCAT420(0xfffffff8,
                                                       CONCAT416(0xfffffff8,
                                                                 CONCAT412(0xfffffff8,
                                                                           CONCAT48(0xfffffff8,
                                                                                                                                                                        
                                                  0xfffffff8fffffff8)))))));
      uVar37 = local_2628;
    }
LAB_0078e7cd:
    if (local_2620 == stack) {
      return;
    }
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }